

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenastring.cc
# Opt level: O3

string * __thiscall
google::protobuf::internal::ArenaStringPtr::MutableNoCopy
          (ArenaStringPtr *this,string *default_value,Arena *arena)

{
  string *psVar1;
  
  if ((string *)(this->tagged_ptr_).ptr_ != default_value) {
    psVar1 = UnsafeMutablePointer_abi_cxx11_(this);
    return psVar1;
  }
  if (arena == (Arena *)0x0) {
    psVar1 = (string *)operator_new(0x20);
  }
  else {
    if (((byte)arena[0x18] & 1) != 0) {
      MutableNoCopy((ArenaStringPtr *)arena);
    }
    psVar1 = (string *)
             ArenaImpl::AllocateAlignedAndAddCleanup
                       ((ArenaImpl *)arena,0x20,arena_destruct_object<std::__cxx11::string>);
  }
  (psVar1->_M_dataplus)._M_p = (pointer)&psVar1->field_2;
  psVar1->_M_string_length = 0;
  (psVar1->field_2)._M_local_buf[0] = '\0';
  (this->tagged_ptr_).ptr_ = psVar1;
  return psVar1;
}

Assistant:

std::string* ArenaStringPtr::MutableNoCopy(const std::string* default_value,
                                           ::google::protobuf::Arena* arena) {
  if (!IsDonatedString() && !IsDefault(default_value)) {
    return UnsafeMutablePointer();
  } else {
    GOOGLE_DCHECK(IsDefault(default_value));
    // Allocate empty. The contents are not relevant.
    std::string* new_string = Arena::Create<std::string>(arena);
    tagged_ptr_.Set(new_string);
    return new_string;
  }
}